

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86func.cpp
# Opt level: O3

Error asmjit::v1_14::x86::FuncInternal::initCallConv
                (CallConv *cc,CallConvId ccId,Environment *environment)

{
  Array<unsigned_char,_4UL> *this;
  Array<unsigned_char,_4UL> *this_00;
  CallConvFlags CVar1;
  bool bVar2;
  undefined4 uVar3;
  Error EVar4;
  uchar *puVar5;
  long lVar6;
  CallConvId CVar7;
  undefined7 in_register_00000031;
  long lVar8;
  long lVar9;
  undefined4 uVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  RegGroup local_3e [10];
  uint local_34;
  
  local_34 = (uint)CONCAT71(in_register_00000031,ccId);
  bVar2 = true;
  bVar13 = environment->_platform == kWindows;
  bVar14 = environment->_platformABI == kMSVC;
  cc->_arch = environment->_arch;
  local_3e[4] = 1;
  this = &cc->_saveRestoreRegSize;
  puVar5 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,local_3e + 4);
  *puVar5 = '\x10';
  local_3e[3] = 3;
  puVar5 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,local_3e + 3);
  *puVar5 = '\b';
  local_3e[2] = 2;
  puVar5 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,local_3e + 2);
  *puVar5 = '\b';
  local_3e[9] = 1;
  this_00 = &cc->_saveRestoreAlignment;
  puVar5 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3e + 9);
  *puVar5 = '\x10';
  local_3e[8] = 3;
  puVar5 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3e + 8);
  *puVar5 = '\b';
  local_3e[7] = 2;
  puVar5 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3e + 7);
  *puVar5 = '\b';
  if ((environment->_arch & k32BitMask) == kUnknown) {
    local_3e[0] = k0;
    puVar5 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>(this,local_3e);
    *puVar5 = '\b';
    local_3e[5] = 0;
    puVar5 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                       (this_00,local_3e + 5);
    *puVar5 = '\b';
    CVar7 = (CallConvId)local_34;
    local_34 = local_34 & 0xff;
    if ((local_34 - 4 < 4) || (local_34 < 3)) {
      if (bVar14 || bVar13) {
LAB_00143693:
        cc->_strategy = kX64Windows;
        cc->_flags = kVarArgCompatible|kPassMmxByGp|kPassFloatsByVec|kIndirectVecArgs;
        cc->_spillZoneSize = ' ';
        cc->_naturalStackAlignment = '\x10';
        *(undefined8 *)(cc->_passedOrder)._data = 0xffffffff09080201;
        *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
        (cc->_passedRegs)._data[0] = 0x306;
        (cc->_passedRegs)._data[1] = 0xf;
        *(undefined8 *)((cc->_passedOrder)._data + 1) = 0xffffffff03020100;
        *(undefined8 *)((long)(cc->_passedOrder)._data + 0x18) = 0xffffffffffffffff;
        (cc->_preservedRegs)._data[0] = 0xf0f8;
        (cc->_preservedRegs)._data[1] = 0xffc0;
        CVar7 = kMaxValue;
      }
      else {
LAB_001436de:
        cc->_flags = kVarArgCompatible|kPassMmxByXmm|kPassFloatsByVec;
        cc->_naturalStackAlignment = '\x10';
        cc->_redZoneSize = 0x80;
        *(undefined8 *)(cc->_passedOrder)._data = 0xffff090801020607;
        *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
        (cc->_passedRegs)._data[0] = 0x3c6;
        (cc->_passedRegs)._data[1] = 0xff;
        *(undefined8 *)((cc->_passedOrder)._data + 1) = 0x706050403020100;
        *(undefined8 *)((long)(cc->_passedOrder)._data + 0x18) = 0xffffffffffffffff;
        (cc->_preservedRegs)._data[0] = 0xf038;
        CVar7 = kX64SystemV;
      }
    }
    else if (local_34 - 0x10 < 3) {
      cc->_flags = kPassFloatsByVec;
      cc->_naturalStackAlignment = '\x10';
      *(undefined8 *)(cc->_passedOrder)._data = 0xffffff0706010200;
      *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
      *(undefined8 *)((cc->_passedOrder)._data + 1) = 0x706050403020100;
      *(undefined8 *)((long)(cc->_passedOrder)._data + 0x18) = 0xffffffffffffffff;
      *(undefined8 *)((cc->_passedOrder)._data + 2) = 0x706050403020100;
      *(undefined8 *)((long)(cc->_passedOrder)._data + 0x28) = 0xffffffffffffffff;
      *(undefined8 *)((cc->_passedOrder)._data + 3) = 0x706050403020100;
      *(undefined8 *)((long)(cc->_passedOrder)._data + 0x38) = 0xffffffffffffffff;
      (cc->_passedRegs)._data[0] = 199;
      (cc->_passedRegs)._data[1] = 0xff;
      (cc->_passedRegs)._data[2] = 0xff;
      (cc->_passedRegs)._data[3] = 0xff;
      (cc->_preservedRegs)._data[0] = 0xffff;
      (cc->_preservedRegs)._data[1] = (uint)(-1L << (CVar7 - 0xe & 0x3f));
    }
    else {
      if (local_34 != 3) {
        if (local_34 == 0x20) goto LAB_001436de;
        if (local_34 != 0x21) {
          return 2;
        }
        goto LAB_00143693;
      }
      cc->_strategy = kMaxValue;
      cc->_flags = kPassMmxByGp|kPassFloatsByVec;
      cc->_spillZoneSize = '0';
      cc->_naturalStackAlignment = '\x10';
      *(undefined8 *)(cc->_passedOrder)._data = 0xffffffff09080201;
      *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
      (cc->_passedRegs)._data[0] = 0x306;
      (cc->_passedRegs)._data[1] = 0x3f;
      *(undefined8 *)((cc->_passedOrder)._data + 1) = 0xffff050403020100;
      *(undefined8 *)((long)(cc->_passedOrder)._data + 0x18) = 0xffffffffffffffff;
      (cc->_preservedRegs)._data[0] = 0xf0f8;
      (cc->_preservedRegs)._data[1] = 0xffc0;
      CVar7 = kVectorCall;
    }
    goto LAB_00143840;
  }
  local_3e[1] = 0;
  puVar5 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this,local_3e + 1);
  *puVar5 = '\x04';
  local_3e[6] = 0;
  puVar5 = Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                     (this_00,local_3e + 6);
  *puVar5 = '\x04';
  (cc->_preservedRegs)._data[0] = 0xf8;
  cc->_naturalStackAlignment = '\x04';
  EVar4 = 2;
  CVar7 = (CallConvId)local_34;
  if (kLightCall4 < CVar7) {
    return 2;
  }
  local_34 = local_34 & 0xff;
  lVar6 = 0x14;
  lVar8 = 0x40;
  lVar9 = 0x3c;
  uVar10 = 0xffffffff;
  lVar11 = 0x38;
  lVar12 = 0x34;
  switch(local_34) {
  case 0:
    goto switchD_00143632_caseD_0;
  case 1:
    lVar6 = 8;
    goto LAB_00143808;
  case 2:
    cc->_flags = kCalleePopsStack;
    local_34 = 6;
    uVar3 = 0xffff0201;
    break;
  case 3:
    cc->_flags = kCalleePopsStack;
    *(undefined8 *)(cc->_passedOrder)._data = 0xffffffffffff0201;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
    (cc->_passedRegs)._data[0] = 6;
    local_34 = 0x3f;
    lVar6 = 0x18;
    lVar8 = 0x50;
    lVar9 = 0x4c;
    uVar10 = 0xffff0504;
    lVar11 = 0x48;
    uVar3 = 0x3020100;
    lVar12 = 0x44;
    break;
  case 4:
    if (bVar14 || bVar13) {
      cc->_flags = kCalleePopsStack;
      local_34 = 2;
      uVar3 = 0xffffff01;
      break;
    }
    CVar7 = kCDecl;
    goto switchD_00143632_caseD_0;
  case 5:
    local_34 = 1;
    uVar3 = 0xffffff00;
    break;
  case 6:
    local_34 = 5;
    uVar3 = 0xffff0200;
    break;
  case 7:
    local_34 = 7;
    uVar3 = 0xff010200;
    break;
  default:
    goto switchD_00143632_caseD_8;
  case 0x10:
  case 0x11:
  case 0x12:
    cc->_flags = kPassFloatsByVec;
    *(undefined8 *)(cc->_passedOrder)._data = 0xffffff0706010200;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 8) = 0xffffffffffffffff;
    *(undefined8 *)((cc->_passedOrder)._data + 1) = 0x706050403020100;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 0x18) = 0xffffffffffffffff;
    *(undefined8 *)((cc->_passedOrder)._data + 2) = 0x706050403020100;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 0x28) = 0xffffffffffffffff;
    *(undefined8 *)((cc->_passedOrder)._data + 3) = 0x706050403020100;
    *(undefined8 *)((long)(cc->_passedOrder)._data + 0x38) = 0xffffffffffffffff;
    (cc->_passedRegs)._data[0] = 199;
    (cc->_passedRegs)._data[1] = 0xff;
    (cc->_passedRegs)._data[2] = 0xff;
    (cc->_passedRegs)._data[3] = 0xff;
    (cc->_preservedRegs)._data[0] = 0xff;
    (cc->_preservedRegs)._data[1] = (uint)(-1L << (CVar7 - 0xe & 0x3f)) & 0xff;
    cc->_naturalStackAlignment = '\x10';
    goto LAB_00143840;
  }
  *(undefined4 *)(cc->_reserved + lVar12 + -6) = uVar3;
  *(undefined4 *)(cc->_reserved + lVar11 + -6) = uVar10;
  *(undefined4 *)(cc->_reserved + lVar9 + -6) = 0xffffffff;
  *(undefined4 *)(cc->_reserved + lVar8 + -6) = 0xffffffff;
LAB_00143808:
  *(uint *)(cc->_reserved + lVar6 + -6) = local_34;
  bVar2 = false;
switchD_00143632_caseD_0:
  *(undefined8 *)((cc->_passedOrder)._data + 3) = 0xffffffffff020100;
  *(undefined8 *)((long)(cc->_passedOrder)._data + 0x38) = 0xffffffffffffffff;
  (cc->_passedRegs)._data[3] = 7;
  *(undefined8 *)((cc->_passedOrder)._data + 1) = 0xffffffffff020100;
  *(undefined8 *)((long)(cc->_passedOrder)._data + 0x18) = 0xffffffffffffffff;
  (cc->_passedRegs)._data[1] = 7;
  CVar1 = cc->_flags;
  cc->_flags = CVar1 | kPassVecByStackIfVA;
  if (bVar2) {
    cc->_flags = CVar1 | (kVarArgCompatible|kPassVecByStackIfVA);
    CVar7 = kCDecl;
  }
LAB_00143840:
  cc->_id = CVar7;
  EVar4 = 0;
switchD_00143632_caseD_8:
  return EVar4;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initCallConv(CallConv& cc, CallConvId ccId, const Environment& environment) noexcept {
  constexpr uint32_t kZax = Gp::kIdAx;
  constexpr uint32_t kZbx = Gp::kIdBx;
  constexpr uint32_t kZcx = Gp::kIdCx;
  constexpr uint32_t kZdx = Gp::kIdDx;
  constexpr uint32_t kZsp = Gp::kIdSp;
  constexpr uint32_t kZbp = Gp::kIdBp;
  constexpr uint32_t kZsi = Gp::kIdSi;
  constexpr uint32_t kZdi = Gp::kIdDi;

  bool winABI = environment.isPlatformWindows() || environment.isMSVC();

  cc.setArch(environment.arch());
  cc.setSaveRestoreRegSize(RegGroup::kVec, 16);
  cc.setSaveRestoreRegSize(RegGroup::kX86_MM, 8);
  cc.setSaveRestoreRegSize(RegGroup::kX86_K, 8);
  cc.setSaveRestoreAlignment(RegGroup::kVec, 16);
  cc.setSaveRestoreAlignment(RegGroup::kX86_MM, 8);
  cc.setSaveRestoreAlignment(RegGroup::kX86_K, 8);

  if (environment.is32Bit()) {
    bool isStandardCallConv = true;

    cc.setSaveRestoreRegSize(RegGroup::kGp, 4);
    cc.setSaveRestoreAlignment(RegGroup::kGp, 4);

    cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(Gp::kIdBx, Gp::kIdSp, Gp::kIdBp, Gp::kIdSi, Gp::kIdDi));
    cc.setNaturalStackAlignment(4);

    switch (ccId) {
      case CallConvId::kCDecl:
        break;

      case CallConvId::kStdCall:
        cc.setFlags(CallConvFlags::kCalleePopsStack);
        break;

      case CallConvId::kFastCall:
        cc.setFlags(CallConvFlags::kCalleePopsStack);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx);
        break;

      case CallConvId::kVectorCall:
        cc.setFlags(CallConvFlags::kCalleePopsStack);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5);
        break;

      case CallConvId::kThisCall:
        // NOTE: Even MINGW (starting with GCC 4.7.0) now uses __thiscall on MS Windows, so we won't bail to any
        // other calling convention if __thiscall was specified.
        if (winABI) {
          cc.setFlags(CallConvFlags::kCalleePopsStack);
          cc.setPassedOrder(RegGroup::kGp, kZcx);
        }
        else {
          ccId = CallConvId::kCDecl;
        }
        break;

      case CallConvId::kRegParm1:
        cc.setPassedOrder(RegGroup::kGp, kZax);
        break;

      case CallConvId::kRegParm2:
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx);
        break;

      case CallConvId::kRegParm3:
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx, kZcx);
        break;

      case CallConvId::kLightCall2:
      case CallConvId::kLightCall3:
      case CallConvId::kLightCall4: {
        uint32_t n = uint32_t(ccId) - uint32_t(CallConvId::kLightCall2) + 2;

        cc.setFlags(CallConvFlags::kPassFloatsByVec);
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx, kZcx, kZsi, kZdi);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_K, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_MM, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPreservedRegs(RegGroup::kGp, Support::lsbMask<uint32_t>(8));
        cc.setPreservedRegs(RegGroup::kVec, Support::lsbMask<uint32_t>(8) & ~Support::lsbMask<uint32_t>(n));

        cc.setNaturalStackAlignment(16);
        isStandardCallConv = false;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidArgument);
    }

    if (isStandardCallConv) {
      // MMX arguments is something where compiler vendors disagree. For example GCC and MSVC would pass first three
      // via registers and the rest via stack, however Clang passes all via stack. Returning MMX registers is even
      // more fun, where GCC uses MM0, but Clang uses EAX:EDX pair. I'm not sure it's something we should be worried
      // about as MMX is deprecated anyway.
      cc.setPassedOrder(RegGroup::kX86_MM, 0, 1, 2);

      // Vector arguments (XMM|YMM|ZMM) are passed via registers. However, if the function is variadic then they have
      // to be passed via stack.
      cc.setPassedOrder(RegGroup::kVec, 0, 1, 2);

      // Functions with variable arguments always use stack for MM and vector arguments.
      cc.addFlags(CallConvFlags::kPassVecByStackIfVA);
    }

    if (ccId == CallConvId::kCDecl) {
      cc.addFlags(CallConvFlags::kVarArgCompatible);
    }
  }
  else {
    cc.setSaveRestoreRegSize(RegGroup::kGp, 8);
    cc.setSaveRestoreAlignment(RegGroup::kGp, 8);

    // Preprocess the calling convention into a common id as many conventions are normally ignored even by C/C++
    // compilers and treated as `__cdecl`.
    if (shouldTreatAsCDeclIn64BitMode(ccId))
      ccId = winABI ? CallConvId::kX64Windows : CallConvId::kX64SystemV;

    switch (ccId) {
      case CallConvId::kX64SystemV: {
        cc.setFlags(CallConvFlags::kPassFloatsByVec |
                    CallConvFlags::kPassMmxByXmm    |
                    CallConvFlags::kVarArgCompatible);
        cc.setNaturalStackAlignment(16);
        cc.setRedZoneSize(128);
        cc.setPassedOrder(RegGroup::kGp, kZdi, kZsi, kZdx, kZcx, 8, 9);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(kZbx, kZsp, kZbp, 12, 13, 14, 15));
        break;
      }

      case CallConvId::kX64Windows: {
        cc.setStrategy(CallConvStrategy::kX64Windows);
        cc.setFlags(CallConvFlags::kPassFloatsByVec |
                    CallConvFlags::kIndirectVecArgs |
                    CallConvFlags::kPassMmxByGp     |
                    CallConvFlags::kVarArgCompatible);
        cc.setNaturalStackAlignment(16);
        // Maximum 4 arguments in registers, each adds 8 bytes to the spill zone.
        cc.setSpillZoneSize(4 * 8);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx, 8, 9);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3);
        cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(kZbx, kZsp, kZbp, kZsi, kZdi, 12, 13, 14, 15));
        cc.setPreservedRegs(RegGroup::kVec, Support::bitMask(6, 7, 8, 9, 10, 11, 12, 13, 14, 15));
        break;
      }

      case CallConvId::kVectorCall: {
        cc.setStrategy(CallConvStrategy::kX64VectorCall);
        cc.setFlags(CallConvFlags::kPassFloatsByVec |
                    CallConvFlags::kPassMmxByGp     );
        cc.setNaturalStackAlignment(16);
        // Maximum 6 arguments in registers, each adds 8 bytes to the spill zone.
        cc.setSpillZoneSize(6 * 8);
        cc.setPassedOrder(RegGroup::kGp, kZcx, kZdx, 8, 9);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5);
        cc.setPreservedRegs(RegGroup::kGp, Support::bitMask(kZbx, kZsp, kZbp, kZsi, kZdi, 12, 13, 14, 15));
        cc.setPreservedRegs(RegGroup::kVec, Support::bitMask(6, 7, 8, 9, 10, 11, 12, 13, 14, 15));
        break;
      }

      case CallConvId::kLightCall2:
      case CallConvId::kLightCall3:
      case CallConvId::kLightCall4: {
        uint32_t n = uint32_t(ccId) - uint32_t(CallConvId::kLightCall2) + 2;

        cc.setFlags(CallConvFlags::kPassFloatsByVec);
        cc.setNaturalStackAlignment(16);
        cc.setPassedOrder(RegGroup::kGp, kZax, kZdx, kZcx, kZsi, kZdi);
        cc.setPassedOrder(RegGroup::kVec, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_K, 0, 1, 2, 3, 4, 5, 6, 7);
        cc.setPassedOrder(RegGroup::kX86_MM, 0, 1, 2, 3, 4, 5, 6, 7);

        cc.setPreservedRegs(RegGroup::kGp, Support::lsbMask<uint32_t>(16));
        cc.setPreservedRegs(RegGroup::kVec, ~Support::lsbMask<uint32_t>(n));
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidArgument);
    }
  }

  cc.setId(ccId);
  return kErrorOk;
}